

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayout::updateSeparatorWidgets(QDockAreaLayout *this)

{
  QList<QWidget_*> *this_00;
  bool bVar1;
  QMainWindowLayout *pQVar2;
  QWidget *t;
  pointer ppQVar3;
  int iVar4;
  int i;
  long lVar5;
  long size;
  int i_1;
  QDockAreaLayoutInfo *this_01;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QRect QVar8;
  QPoint local_88;
  QRect local_80;
  QRect local_70;
  QRegion local_60;
  QRect local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = this->docks;
  this_00 = &this->separatorWidgets;
  iVar4 = 0;
  for (lVar5 = 0; size = (long)iVar4, lVar6 = size, lVar5 != 4; lVar5 = lVar5 + 1) {
    bVar1 = QDockAreaLayoutInfo::isEmpty(this_01);
    if (!bVar1) {
      if (size < (this->separatorWidgets).d.size) {
        t = (this->separatorWidgets).d.ptr[size];
        if (t == (QWidget *)0x0) {
          local_58.x1.m_i = 2;
          local_58.y1.m_i = 0;
          local_58.x2.m_i = 0;
          local_58.y2.m_i = 0;
          uStack_48 = 0;
          local_44 = 0;
          local_40 = "default";
          QMessageLogger::warning
                    ((char *)&local_58,
                     "QDockAreaLayout::updateSeparatorWidgets: null separator widget");
          pQVar2 = qt_mainwindow_layout(this->mainWindow);
          t = QMainWindowLayout::getSeparatorWidget((QMainWindowLayout *)pQVar2);
          ppQVar3 = QList<QWidget_*>::data(this_00);
          ppQVar3[size] = t;
        }
      }
      else {
        pQVar2 = qt_mainwindow_layout(this->mainWindow);
        t = QMainWindowLayout::getSeparatorWidget((QMainWindowLayout *)pQVar2);
        QList<QWidget_*>::append(this_00,t);
      }
      iVar4 = iVar4 + 1;
      raiseSeparatorWidget(t);
      local_58.x1.m_i = -0x55555556;
      local_58.y1.m_i = -0x55555556;
      local_58.x2.m_i = -0x55555556;
      local_58.y2.m_i = -0x55555556;
      QVar8 = separatorRect(this,(int)lVar5);
      auVar7._12_4_ = QVar8.y2.m_i;
      auVar7._0_4_ = (undefined4)(QVar8._0_8_ + 0xfffffffe);
      auVar7._8_4_ = (undefined4)(QVar8._8_8_ + 2);
      auVar7._4_4_ = auVar7._8_4_;
      local_58._0_8_ = CONCAT44(QVar8.y1.m_i.m_i,auVar7._0_4_) - 0x200000000;
      local_58._8_8_ = auVar7._8_8_ + 0x200000000;
      QWidget::setGeometry(t,&local_58);
      local_80 = separatorRect(this,(int)lVar5);
      local_88 = (QPoint)((ulong)(uint)-local_58.x1.m_i - (local_58._0_8_ & 0xffffffff00000000));
      local_70 = QRect::translated(&local_80,&local_88);
      QRegion::QRegion(&local_60,&local_70,Rectangle);
      QWidget::setMask(t,&local_60);
      QRegion::~QRegion(&local_60);
      QWidget::show(t);
    }
    this_01 = this_01 + 1;
  }
  for (; lVar6 < (this->separatorWidgets).d.size; lVar6 = lVar6 + 1) {
    QWidget::hide((this->separatorWidgets).d.ptr[lVar6]);
  }
  QList<QWidget_*>::resize(this_00,size);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::updateSeparatorWidgets() const
{
    int j = 0;

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;

        QWidget *sepWidget;
        if (j < separatorWidgets.size()) {
            sepWidget = separatorWidgets.at(j);
            if (!sepWidget) {
                qWarning("QDockAreaLayout::updateSeparatorWidgets: null separator widget");
                sepWidget = qt_mainwindow_layout(mainWindow)->getSeparatorWidget();
                separatorWidgets[j] = sepWidget;
            }
        } else {
            sepWidget = qt_mainwindow_layout(mainWindow)->getSeparatorWidget();
            separatorWidgets.append(sepWidget);
        }
        j++;

        Q_ASSERT(sepWidget);
        raiseSeparatorWidget(sepWidget);

        QRect sepRect = separatorRect(i).adjusted(-2, -2, 2, 2);
        sepWidget->setGeometry(sepRect);
        sepWidget->setMask( QRegion(separatorRect(i).translated( - sepRect.topLeft())));
        sepWidget->show();
    }
    for (int i = j; i < separatorWidgets.size(); ++i)
        separatorWidgets.at(i)->hide();

    separatorWidgets.resize(j);
}